

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRevoluteSpherical::Initialize
          (ChLinkRevoluteSpherical *this,shared_ptr<chrono::ChBody> *body1,
          shared_ptr<chrono::ChBody> *body2,bool local,ChVector<double> *pos1,ChVector<double> *dir1
          ,ChVector<double> *pos2,bool auto_distance,double distance)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  element_type *peVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined7 in_register_00000009;
  ChBodyFrame *pCVar6;
  ChBodyFrame *pCVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 local_e8 [16];
  double local_d8;
  uint local_cc;
  ChVector<double> local_c8;
  ChVector<double> local_a8;
  ChVector<double> local_88;
  double local_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  
  peVar3 = (body1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar7 = &peVar3->super_ChBodyFrame;
  local_cc = (uint)auto_distance;
  if (peVar3 == (element_type *)0x0) {
    pCVar7 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body1 = pCVar7;
  peVar3 = (body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar6 = &peVar3->super_ChBodyFrame;
  if (peVar3 == (element_type *)0x0) {
    pCVar6 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body2 = pCVar6;
  local_48 = distance;
  iVar4 = (*(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar5 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dist,(ChVariables *)CONCAT44(extraout_var,iVar4),
             (ChVariables *)CONCAT44(extraout_var_00,iVar5));
  iVar4 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar5 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dot,(ChVariables *)CONCAT44(extraout_var_01,iVar4),
             (ChVariables *)CONCAT44(extraout_var_02,iVar5));
  local_88.m_data[2] = 0.0;
  local_a8.m_data[2] = 0.0;
  local_c8.m_data[2] = 0.0;
  local_88.m_data[0] = 0.0;
  local_88.m_data[1] = 0.0;
  local_a8.m_data[0] = 0.0;
  local_a8.m_data[1] = 0.0;
  local_c8.m_data[0] = 0.0;
  local_c8.m_data[1] = 0.0;
  if ((int)CONCAT71(in_register_00000009,local) == 0) {
    if (&local_88 != pos1) {
      local_88.m_data[0] = pos1->m_data[0];
      local_88.m_data[1] = pos1->m_data[1];
      local_88.m_data[2] = pos1->m_data[2];
    }
    if (&local_a8 != pos2) {
      local_a8.m_data[0] = pos2->m_data[0];
      local_a8.m_data[1] = pos2->m_data[1];
      local_a8.m_data[2] = pos2->m_data[2];
    }
    Vnorm<double>((ChVector<double> *)local_e8,dir1);
    local_c8.m_data[0] = (double)local_e8._0_8_;
    local_c8.m_data[1] = (double)local_e8._8_8_;
    local_c8.m_data[2] = local_d8;
    ChFrame<double>::TransformPointParentToLocal
              ((ChVector<double> *)local_e8,(ChFrame<double> *)(this->super_ChLink).Body1,&local_88)
    ;
    if ((ChVector<double> *)local_e8 != &this->m_pos1) {
      (this->m_pos1).m_data[0] = (double)local_e8._0_8_;
      (this->m_pos1).m_data[1] = (double)local_e8._8_8_;
      (this->m_pos1).m_data[2] = local_d8;
    }
    ChFrame<double>::TransformPointParentToLocal
              ((ChVector<double> *)local_e8,(ChFrame<double> *)(this->super_ChLink).Body2,&local_a8)
    ;
    if ((ChVector<double> *)local_e8 != &this->m_pos2) {
      (this->m_pos2).m_data[0] = (double)local_e8._0_8_;
      (this->m_pos2).m_data[1] = (double)local_e8._8_8_;
      (this->m_pos2).m_data[2] = local_d8;
    }
    ChFrame<double>::TransformDirectionParentToLocal
              ((ChVector<double> *)local_e8,(ChFrame<double> *)(this->super_ChLink).Body1,&local_c8)
    ;
    if ((ChVector<double> *)local_e8 != &this->m_dir1) {
      (this->m_dir1).m_data[0] = (double)local_e8._0_8_;
      (this->m_dir1).m_data[1] = (double)local_e8._8_8_;
      (this->m_dir1).m_data[2] = local_d8;
    }
    auVar13._8_8_ = local_a8.m_data[1];
    auVar13._0_8_ = local_a8.m_data[0];
    auVar11._8_8_ = local_88.m_data[1];
    auVar11._0_8_ = local_88.m_data[0];
    dVar8 = local_88.m_data[2];
    local_d8 = local_a8.m_data[2];
  }
  else {
    if (&this->m_pos1 != pos1) {
      (this->m_pos1).m_data[0] = pos1->m_data[0];
      (this->m_pos1).m_data[1] = pos1->m_data[1];
      (this->m_pos1).m_data[2] = pos1->m_data[2];
    }
    if (&this->m_pos2 != pos2) {
      (this->m_pos2).m_data[0] = pos2->m_data[0];
      (this->m_pos2).m_data[1] = pos2->m_data[1];
      (this->m_pos2).m_data[2] = pos2->m_data[2];
    }
    Vnorm<double>((ChVector<double> *)local_e8,dir1);
    if ((ChVector<double> *)local_e8 != &this->m_dir1) {
      (this->m_dir1).m_data[0] = (double)local_e8._0_8_;
      (this->m_dir1).m_data[1] = (double)local_e8._8_8_;
      (this->m_dir1).m_data[2] = local_d8;
    }
    ChFrame<double>::TransformPointLocalToParent
              ((ChVector<double> *)local_e8,(ChFrame<double> *)(this->super_ChLink).Body1,
               &this->m_pos1);
    dVar8 = local_d8;
    local_88.m_data[2] = local_d8;
    local_88.m_data[0] = (double)local_e8._0_8_;
    local_88.m_data[1] = (double)local_e8._8_8_;
    local_58 = (double)local_e8._0_8_;
    dStack_50 = (double)local_e8._8_8_;
    ChFrame<double>::TransformPointLocalToParent
              ((ChVector<double> *)local_e8,(ChFrame<double> *)(this->super_ChLink).Body2,
               &this->m_pos2);
    local_a8.m_data[0] = (double)local_e8._0_8_;
    local_a8.m_data[1] = (double)local_e8._8_8_;
    local_a8.m_data[2] = local_d8;
    local_68 = (double)local_e8._0_8_;
    dStack_60 = (double)local_e8._8_8_;
    local_70 = local_d8;
    ChMatrix33<double>::operator*
              (&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                Amatrix,&this->m_dir1);
    auVar13._8_8_ = dStack_60;
    auVar13._0_8_ = local_68;
    auVar11._8_8_ = dStack_50;
    auVar11._0_8_ = local_58;
    local_c8.m_data[0] = (double)local_e8._0_8_;
    local_c8.m_data[1] = (double)local_e8._8_8_;
    local_c8.m_data[2] = local_d8;
    local_d8 = local_70;
  }
  local_d8 = local_d8 - dVar8;
  local_e8 = vsubpd_avx(auVar13,auVar11);
  dVar8 = ChVector<double>::Length((ChVector<double> *)local_e8);
  this->m_cur_dist = dVar8;
  this->m_dist = (double)((ulong)((byte)local_cc & 1) * (long)dVar8 +
                         (ulong)!(bool)((byte)local_cc & 1) * (long)local_48);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_e8._0_8_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_c8.m_data[0];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (double)local_e8._8_8_ * local_c8.m_data[1];
  auVar13 = vfmadd231sd_fma(auVar12,auVar9,auVar1);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_d8;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_c8.m_data[2];
  auVar13 = vfmadd132sd_fma(auVar10,auVar13,auVar2);
  this->m_cur_dot = auVar13._0_8_;
  return;
}

Assistant:

void ChLinkRevoluteSpherical::Initialize(std::shared_ptr<ChBody> body1,
                                         std::shared_ptr<ChBody> body2,
                                         bool local,
                                         const ChVector<>& pos1,
                                         const ChVector<>& dir1,
                                         const ChVector<>& pos2,
                                         bool auto_distance,
                                         double distance) {
    Body1 = body1.get();
    Body2 = body2.get();

    m_cnstr_dist.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_dot.SetVariables(&Body1->Variables(), &Body2->Variables());

    ChVector<> pos1_abs;
    ChVector<> pos2_abs;
    ChVector<> dir1_abs;

    if (local) {
        m_pos1 = pos1;
        m_pos2 = pos2;
        m_dir1 = Vnorm(dir1);
        pos1_abs = Body1->TransformPointLocalToParent(m_pos1);
        pos2_abs = Body2->TransformPointLocalToParent(m_pos2);
        dir1_abs = Body1->TransformDirectionLocalToParent(m_dir1);
    } else {
        pos1_abs = pos1;
        pos2_abs = pos2;
        dir1_abs = Vnorm(dir1);
        m_pos1 = Body1->TransformPointParentToLocal(pos1_abs);
        m_pos2 = Body2->TransformPointParentToLocal(pos2_abs);
        m_dir1 = Body1->TransformDirectionParentToLocal(dir1_abs);
    }

    ChVector<> d12_abs = pos2_abs - pos1_abs;

    m_cur_dist = d12_abs.Length();
    m_dist = auto_distance ? m_cur_dist : distance;

    m_cur_dot = Vdot(d12_abs, dir1_abs);
}